

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threaded_clusterizer.h
# Opt level: O0

void __thiscall
crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::create_clusters_task
          (threaded_clusterizer<crnlib::vec<16U,_float>_> *this,uint64 data,void *pData_ptr)

{
  uint uVar1;
  vector<unsigned_int> *this_00;
  uint uVar2;
  uint *puVar3;
  weighted_vec *v_00;
  crn_thread_id_t cVar4;
  vector<unsigned_int> *this_01;
  bool bVar5;
  progress_callback_func_ptr local_80;
  uint local_5c;
  uint j;
  vector<unsigned_int> *indices;
  uint i_1;
  uint num_clusters;
  bool quick;
  bool is_main_thread;
  weighted_vec *v;
  uint index;
  uint i;
  create_clusters_task_state *state;
  uint partition_index;
  void *pData_ptr_local;
  uint64 data_local;
  threaded_clusterizer<crnlib::vec<16U,_float>_> *this_local;
  
  if ((this->m_canceled & 1U) == 0) {
    clusterizer<crnlib::vec<16U,_float>_>::clear(this->m_clusterizers + (data & 0xffffffff));
    for (v._4_4_ = 0;
        uVar2 = vector<unsigned_int>::size(*(vector<unsigned_int> **)((long)pData_ptr + 8)),
        v._4_4_ < uVar2; v._4_4_ = v._4_4_ + 1) {
      puVar3 = vector<unsigned_int>::operator[]
                         (*(vector<unsigned_int> **)((long)pData_ptr + 8),v._4_4_);
      v_00 = vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>::
             operator[](*pData_ptr,*puVar3);
      clusterizer<crnlib::vec<16U,_float>_>::add_training_vec
                (this->m_clusterizers + (data & 0xffffffff),&v_00->m_vec,v_00->m_weight);
    }
    if ((this->m_canceled & 1U) == 0) {
      cVar4 = crn_get_current_thread_id();
      bVar5 = cVar4 == this->m_main_thread_id;
      if ((bVar5) && ((this->m_cluster_task_displayed_progress & 1U) == 0)) {
        local_80 = generate_codebook_progress_callback;
      }
      else {
        local_80 = generate_codebook_dummy_progress_callback;
      }
      clusterizer<crnlib::vec<16U,_float>_>::generate_codebook
                (this->m_clusterizers + (data & 0xffffffff),*(uint *)((long)pData_ptr + 0x20),
                 local_80,this,false);
      if (bVar5) {
        this->m_cluster_task_displayed_progress = true;
      }
      if ((this->m_canceled & 1U) == 0) {
        uVar2 = clusterizer<crnlib::vec<16U,_float>_>::get_codebook_size
                          (this->m_clusterizers + (data & 0xffffffff));
        clusterizer<crnlib::vec<16U,_float>_>::retrieve_clusters
                  (this->m_clusterizers + (data & 0xffffffff),uVar2,
                   (vector<crnlib::vector<unsigned_int>_> *)((long)pData_ptr + 0x10));
        for (indices._4_4_ = 0;
            uVar2 = vector<crnlib::vector<unsigned_int>_>::size
                              ((vector<crnlib::vector<unsigned_int>_> *)((long)pData_ptr + 0x10)),
            indices._4_4_ < uVar2; indices._4_4_ = indices._4_4_ + 1) {
          this_01 = vector<crnlib::vector<unsigned_int>_>::operator[]
                              ((vector<crnlib::vector<unsigned_int>_> *)((long)pData_ptr + 0x10),
                               indices._4_4_);
          for (local_5c = 0; uVar2 = vector<unsigned_int>::size(this_01), local_5c < uVar2;
              local_5c = local_5c + 1) {
            this_00 = *(vector<unsigned_int> **)((long)pData_ptr + 8);
            puVar3 = vector<unsigned_int>::operator[](this_01,local_5c);
            puVar3 = vector<unsigned_int>::operator[](this_00,*puVar3);
            uVar1 = *puVar3;
            puVar3 = vector<unsigned_int>::operator[](this_01,local_5c);
            *puVar3 = uVar1;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void create_clusters_task(uint64 data, void* pData_ptr)
        {
            if (m_canceled)
            {
                return;
            }

            const uint partition_index = static_cast<uint>(data);
            create_clusters_task_state& state = *static_cast<create_clusters_task_state*>(pData_ptr);

            m_clusterizers[partition_index].clear();

            for (uint i = 0; i < state.m_pIndices->size(); i++)
            {
                const uint index = (*state.m_pIndices)[i];
                const weighted_vec& v = (*state.m_pWeighted_vecs)[index];

                m_clusterizers[partition_index].add_training_vec(v.m_vec, v.m_weight);
            }

            if (m_canceled)
            {
                return;
            }

            const bool is_main_thread = (crn_get_current_thread_id() == m_main_thread_id);

            const bool quick = false;
            m_clusterizers[partition_index].generate_codebook(
                state.m_max_clusters,
                (is_main_thread && !m_cluster_task_displayed_progress) ? generate_codebook_progress_callback : generate_codebook_dummy_progress_callback,
                this,
                quick);

            if (is_main_thread)
            {
                m_cluster_task_displayed_progress = true;
            }

            if (m_canceled)
            {
                return;
            }

            const uint num_clusters = m_clusterizers[partition_index].get_codebook_size();

            m_clusterizers[partition_index].retrieve_clusters(num_clusters, state.m_cluster_indices);

            for (uint i = 0; i < state.m_cluster_indices.size(); i++)
            {
                crnlib::vector<uint>& indices = state.m_cluster_indices[i];

                for (uint j = 0; j < indices.size(); j++)
                {
                    indices[j] = (*state.m_pIndices)[indices[j]];
                }
            }
        }